

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3ValueBytes(sqlite3_value *pVal,u8 enc)

{
  int iVar1;
  void *pvVar2;
  
  if (((pVal->flags & 0x10) == 0) && (pvVar2 = sqlite3ValueText(pVal,enc), pvVar2 == (void *)0x0)) {
    return 0;
  }
  iVar1 = pVal->n;
  if ((pVal->flags & 0x4000) != 0) {
    iVar1 = iVar1 + (pVal->u).nZero;
  }
  return iVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3ValueBytes(sqlite3_value *pVal, u8 enc){
  Mem *p = (Mem*)pVal;
  if( (p->flags & MEM_Blob)!=0 || sqlite3ValueText(pVal, enc) ){
    if( p->flags & MEM_Zero ){
      return p->n + p->u.nZero;
    }else{
      return p->n;
    }
  }
  return 0;
}